

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O1

uint32_t FAPOBase_ValidateFormatDefault
                   (FAPOBase *fapo,FAudioWaveFormatEx *pFormat,uint8_t fOverwrite)

{
  uint32_t uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  
  if (((((pFormat->wFormatTag != 3) || ((ushort)(pFormat->nChannels - 0x41) < 0xffc0)) ||
       (pFormat->nSamplesPerSec - 0x30d41 < 0xfffcf6a7)) ||
      (uVar1 = 0, pFormat->wBitsPerSample != 0x20)) && (uVar1 = 0x88970001, fOverwrite != '\0')) {
    pFormat->wFormatTag = 3;
    uVar2 = pFormat->nChannels + (ushort)(pFormat->nChannels == 0);
    uVar3 = 0x40;
    if (uVar2 < 0x40) {
      uVar3 = uVar2;
    }
    pFormat->nChannels = uVar3;
    uVar4 = 1000;
    if (1000 < pFormat->nSamplesPerSec) {
      uVar4 = pFormat->nSamplesPerSec;
    }
    if (199999 < uVar4) {
      uVar4 = 200000;
    }
    pFormat->nSamplesPerSec = uVar4;
    pFormat->wBitsPerSample = 0x20;
  }
  return uVar1;
}

Assistant:

uint32_t FAPOBase_ValidateFormatDefault(
	FAPOBase *fapo,
	FAudioWaveFormatEx *pFormat,
	uint8_t fOverwrite
) {
	if (	pFormat->wFormatTag != FAPOBASE_DEFAULT_FORMAT_TAG ||
		pFormat->nChannels < FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS ||
		pFormat->nChannels > FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS ||
		pFormat->nSamplesPerSec < FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE ||
		pFormat->nSamplesPerSec > FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE ||
		pFormat->wBitsPerSample != FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE	)
	{
		if (fOverwrite)
		{
			pFormat->wFormatTag =
				FAPOBASE_DEFAULT_FORMAT_TAG;
			pFormat->nChannels = FAudio_clamp(
				pFormat->nChannels,
				FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS,
				FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS
			);
			pFormat->nSamplesPerSec = FAudio_clamp(
				pFormat->nSamplesPerSec,
				FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE,
				FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE
			);
			pFormat->wBitsPerSample =
				FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE;
		}
		return FAPO_E_FORMAT_UNSUPPORTED;
	}
	return 0;
}